

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCase.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
vkt::getValidationLayers_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,vkt *this,
          vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *supportedLayers)

{
  char *__s;
  bool bVar1;
  long lVar2;
  allocator<char> local_139;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_138;
  string local_130;
  Maybe<unsigned_int> local_110;
  Maybe<unsigned_int> local_100;
  Maybe<unsigned_int> local_f0;
  Maybe<unsigned_int> local_e0;
  RequiredLayer local_d0;
  Maybe<unsigned_int> local_70;
  Maybe<unsigned_int> local_60;
  Maybe<unsigned_int> local_50;
  Maybe<unsigned_int> local_40;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
              __return_storage_ptr__;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"VK_LAYER_LUNARG_standard_validation",&local_139);
  local_40.m_ptr = (uint *)0x0;
  local_50.m_ptr = (uint *)0x0;
  local_60.m_ptr = (uint *)0x0;
  local_70.m_ptr = (uint *)0x0;
  ::vk::RequiredLayer::RequiredLayer(&local_d0,&local_130,&local_40,&local_50,&local_60,&local_70);
  bVar1 = ::vk::isLayerSupported
                    ((vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *)this,
                     &local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_130);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"VK_LAYER_LUNARG_standard_validation",
               (allocator<char> *)&local_130);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(local_138,&local_d0.name);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  else {
    for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 8) {
      __s = *(char **)((long)getValidationLayers::s_defaultLayers + lVar2);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,__s,&local_139);
      local_e0.m_ptr = (uint *)0x0;
      local_f0.m_ptr = (uint *)0x0;
      local_100.m_ptr = (uint *)0x0;
      local_110.m_ptr = (uint *)0x0;
      ::vk::RequiredLayer::RequiredLayer
                (&local_d0,&local_130,&local_e0,&local_f0,&local_100,&local_110);
      bVar1 = ::vk::isLayerSupported
                        ((vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *)
                         this,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_130);
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d0,__s,(allocator<char> *)&local_130);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_138,&local_d0.name);
        std::__cxx11::string::~string((string *)&local_d0);
      }
    }
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_138;
}

Assistant:

vector<string> getValidationLayers (const vector<VkLayerProperties>& supportedLayers)
{
	static const char*	s_magicLayer		= "VK_LAYER_LUNARG_standard_validation";
	static const char*	s_defaultLayers[]	=
	{
		"VK_LAYER_GOOGLE_threading",
		"VK_LAYER_LUNARG_parameter_validation",
		"VK_LAYER_LUNARG_device_limits",
		"VK_LAYER_LUNARG_object_tracker",
		"VK_LAYER_LUNARG_image",
		"VK_LAYER_LUNARG_core_validation",
		"VK_LAYER_LUNARG_swapchain",
		"VK_LAYER_GOOGLE_unique_objects"
	};

	vector<string>		enabledLayers;

	if (isLayerSupported(supportedLayers, RequiredLayer(s_magicLayer)))
		enabledLayers.push_back(s_magicLayer);
	else
	{
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_defaultLayers); ++ndx)
		{
			if (isLayerSupported(supportedLayers, RequiredLayer(s_defaultLayers[ndx])))
				enabledLayers.push_back(s_defaultLayers[ndx]);
		}
	}

	return enabledLayers;
}